

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O1

void ourWriteOut(CURL *curl,per_transfer *per,char *writeinfo)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  char *pcVar10;
  int __c;
  FILE *__stream;
  writeoutvar *pwVar11;
  long lVar12;
  bool bVar13;
  double doubleinfo;
  long longinfo;
  char *stringp;
  undefined8 local_50;
  long local_48;
  char *local_40;
  char local_31;
  
  local_40 = (char *)0x0;
  __stream = _stdout;
  if (writeinfo == (char *)0x0) {
    return;
  }
LAB_0011cb8e:
  do {
    while (cVar1 = *writeinfo, cVar1 != '%') {
      if (cVar1 == '\\') {
        bVar3 = writeinfo[1];
        if (bVar3 < 0x72) {
          if (bVar3 == 0) goto LAB_0011cba4;
          if (bVar3 != 0x6e) {
LAB_0011cc20:
            iVar6 = 0x5c;
            goto LAB_0011cc25;
          }
          __c = 10;
        }
        else if (bVar3 == 0x72) {
          __c = 0xd;
        }
        else {
          if (bVar3 != 0x74) goto LAB_0011cc20;
          __c = 9;
        }
LAB_0011cc39:
        fputc(__c,__stream);
        writeinfo = writeinfo + 2;
      }
      else {
        if (cVar1 == '\0') {
          return;
        }
LAB_0011cba4:
        fputc((int)cVar1,__stream);
        writeinfo = writeinfo + 1;
      }
    }
    cVar2 = writeinfo[1];
    if (cVar2 == '\0') goto LAB_0011cba4;
    if (cVar2 != '{') {
      __c = 0x25;
      iVar6 = 0x25;
      if (cVar2 == '%') goto LAB_0011cc39;
LAB_0011cc25:
      fputc(iVar6,__stream);
      __c = (int)writeinfo[1];
      goto LAB_0011cc39;
    }
    pcVar7 = strchr(writeinfo,0x7d);
    writeinfo = writeinfo + 2;
    if (pcVar7 == (char *)0x0) {
      fputs("%{",__stream);
      goto LAB_0011cb8e;
    }
    local_31 = *pcVar7;
    *pcVar7 = '\0';
    iVar6 = curl_strequal(writeinfo,"url_effective");
    if (iVar6 == 0) {
      lVar5 = 0;
      do {
        lVar12 = lVar5;
        lVar4 = *(long *)((long)&variables[1].name + lVar12);
        if (lVar12 + 0x18 == 0x360) {
          bVar13 = lVar4 == 0;
          goto switchD_0011ccd3_default;
        }
        iVar6 = curl_strequal(writeinfo,lVar4);
        lVar5 = lVar12 + 0x18;
      } while (iVar6 == 0);
      bVar13 = lVar4 == 0;
      pwVar11 = (writeoutvar *)(lVar12 + 0x12d9f8);
    }
    else {
      bVar13 = false;
      pwVar11 = variables;
    }
    switch(pwVar11->id) {
    case VAR_TOTAL_TIME:
      uVar9 = 0x300003;
      goto LAB_0011d020;
    case VAR_NAMELOOKUP_TIME:
      uVar9 = 0x300004;
      goto LAB_0011d020;
    case VAR_CONNECT_TIME:
      uVar9 = 0x300005;
      goto LAB_0011d020;
    case VAR_APPCONNECT_TIME:
      uVar9 = 0x300021;
      goto LAB_0011d020;
    case VAR_PRETRANSFER_TIME:
      uVar9 = 0x300006;
      goto LAB_0011d020;
    case VAR_STARTTRANSFER_TIME:
      uVar9 = 0x300011;
      goto LAB_0011d020;
    case VAR_SIZE_DOWNLOAD:
      uVar9 = 0x300008;
      goto LAB_0011cefa;
    case VAR_SIZE_UPLOAD:
      uVar9 = 0x300007;
LAB_0011cefa:
      iVar6 = curl_easy_getinfo(curl,uVar9,&local_50);
      if (iVar6 != 0) goto switchD_0011ccd3_default;
      pcVar10 = "%.0f";
      goto LAB_0011d03c;
    case VAR_SPEED_DOWNLOAD:
      uVar9 = 0x300009;
      goto LAB_0011cf73;
    case VAR_SPEED_UPLOAD:
      uVar9 = 0x30000a;
LAB_0011cf73:
      iVar6 = curl_easy_getinfo(curl,uVar9,&local_50);
      if (iVar6 != 0) goto switchD_0011ccd3_default;
      pcVar10 = "%.3f";
      goto LAB_0011d03c;
    case VAR_HTTP_CODE:
      uVar9 = 0x200002;
      goto LAB_0011cf42;
    case VAR_HTTP_CODE_PROXY:
      uVar9 = 0x200016;
LAB_0011cf42:
      iVar6 = curl_easy_getinfo(curl,uVar9,&local_48);
      if (iVar6 != 0) goto switchD_0011ccd3_default;
      pcVar10 = "%03ld";
      goto LAB_0011d099;
    case VAR_HEADER_SIZE:
      uVar9 = 0x20000b;
      break;
    case VAR_NUM_HEADERS:
      curl_mfprintf(__stream,"%ld",per->num_headers);
      goto switchD_0011ccd3_default;
    case VAR_REQUEST_SIZE:
      uVar9 = 0x20000c;
      break;
    case VAR_EFFECTIVE_METHOD:
      uVar9 = 0x10003a;
      goto LAB_0011d0b6;
    case VAR_EFFECTIVE_URL:
      uVar9 = 0x100001;
      goto LAB_0011d0b6;
    case VAR_CONTENT_TYPE:
      uVar9 = 0x100012;
      goto LAB_0011d0b6;
    case VAR_NUM_CONNECTS:
      uVar9 = 0x20001a;
      break;
    case VAR_REDIRECT_TIME:
      uVar9 = 0x300013;
LAB_0011d020:
      iVar6 = curl_easy_getinfo(curl,uVar9,&local_50);
      if (iVar6 == 0) {
        pcVar10 = "%.6f";
LAB_0011d03c:
        curl_mfprintf(local_50,__stream,pcVar10);
      }
      goto switchD_0011ccd3_default;
    case VAR_REDIRECT_COUNT:
      uVar9 = 0x200014;
      break;
    case VAR_FTP_ENTRY_PATH:
      uVar9 = 0x10001e;
      goto LAB_0011d0b6;
    case VAR_REDIRECT_URL:
      uVar9 = 0x10001f;
      goto LAB_0011d0b6;
    case VAR_SSL_VERIFY_RESULT:
      uVar9 = 0x20000d;
      break;
    case VAR_PROXY_SSL_VERIFY_RESULT:
      uVar9 = 0x20002f;
      break;
    case VAR_EFFECTIVE_FILENAME:
      pcVar10 = (per->outs).filename;
      if (pcVar10 == (char *)0x0) goto switchD_0011ccd3_default;
      goto LAB_0011d0d7;
    case VAR_PRIMARY_IP:
      uVar9 = 0x100020;
      goto LAB_0011d0b6;
    case VAR_PRIMARY_PORT:
      uVar9 = 0x200028;
      break;
    case VAR_LOCAL_IP:
      uVar9 = 0x100029;
      goto LAB_0011d0b6;
    case VAR_LOCAL_PORT:
      uVar9 = 0x20002a;
      break;
    case VAR_HTTP_VERSION:
      iVar6 = curl_easy_getinfo(curl,0x20002e,&local_48);
      if (iVar6 == 0) {
        pcVar10 = "0";
        if (local_48 < 3) {
          if (local_48 == 1) {
            pcVar10 = "1.0";
          }
          else if (local_48 == 2) {
            pcVar10 = "1.1";
          }
        }
        else if (local_48 == 3) {
          pcVar10 = "2";
        }
        else if (local_48 == 0x1e) {
          pcVar10 = "3";
        }
        curl_mfprintf(__stream,pcVar10);
      }
      goto switchD_0011ccd3_default;
    case VAR_SCHEME:
      uVar9 = 0x100031;
LAB_0011d0b6:
      iVar6 = curl_easy_getinfo(curl,uVar9,&local_40);
      pcVar10 = local_40;
      if (local_40 != (char *)0x0 && iVar6 == 0) {
LAB_0011d0d7:
        fputs(pcVar10,__stream);
      }
      goto switchD_0011ccd3_default;
    case VAR_STDOUT:
      puVar8 = (undefined8 *)&stdout;
      goto LAB_0011cff1;
    case VAR_STDERR:
      puVar8 = (undefined8 *)&stderr;
LAB_0011cff1:
      __stream = (FILE *)*puVar8;
      goto switchD_0011ccd3_default;
    case VAR_JSON:
      ourWriteOutJSON(variables,curl,per,(FILE *)__stream);
    default:
      goto switchD_0011ccd3_default;
    }
    iVar6 = curl_easy_getinfo(curl,uVar9,&local_48);
    if (iVar6 == 0) {
      pcVar10 = "%ld";
LAB_0011d099:
      curl_mfprintf(__stream,pcVar10,local_48);
    }
switchD_0011ccd3_default:
    if (bVar13) {
      curl_mfprintf(_stderr,"curl: unknown --write-out variable: \'%s\'\n",writeinfo);
    }
    writeinfo = pcVar7 + 1;
    *pcVar7 = local_31;
  } while( true );
}

Assistant:

void ourWriteOut(CURL *curl, struct per_transfer *per, const char *writeinfo)
{
  FILE *stream = stdout;
  const char *ptr = writeinfo;
  char *stringp = NULL;
  long longinfo;
  double doubleinfo;

  while(ptr && *ptr) {
    if('%' == *ptr && ptr[1]) {
      if('%' == ptr[1]) {
        /* an escaped %-letter */
        fputc('%', stream);
        ptr += 2;
      }
      else {
        /* this is meant as a variable to output */
        char *end;
        if('{' == ptr[1]) {
          char keepit;
          int i;
          bool match = FALSE;
          end = strchr(ptr, '}');
          ptr += 2; /* pass the % and the { */
          if(!end) {
            fputs("%{", stream);
            continue;
          }
          keepit = *end;
          *end = 0; /* null-terminate */
          for(i = 0; variables[i].name; i++) {
            if(curl_strequal(ptr, variables[i].name)) {
              match = TRUE;
              switch(variables[i].id) {
              case VAR_EFFECTIVE_URL:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_EFFECTIVE_URL, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_EFFECTIVE_METHOD:
                if((CURLE_OK == curl_easy_getinfo(curl,
                                                  CURLINFO_EFFECTIVE_METHOD,
                                                  &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_HTTP_CODE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &longinfo))
                  fprintf(stream, "%03ld", longinfo);
                break;
              case VAR_NUM_HEADERS:
                fprintf(stream, "%ld", per->num_headers);
                break;
              case VAR_HTTP_CODE_PROXY:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HTTP_CONNECTCODE,
                                     &longinfo))
                  fprintf(stream, "%03ld", longinfo);
                break;
              case VAR_HEADER_SIZE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HEADER_SIZE, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REQUEST_SIZE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REQUEST_SIZE, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_NUM_CONNECTS:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_NUM_CONNECTS, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REDIRECT_COUNT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REDIRECT_COUNT, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REDIRECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REDIRECT_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_TOTAL_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_TOTAL_TIME, &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_NAMELOOKUP_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_NAMELOOKUP_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_CONNECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_CONNECT_TIME, &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_APPCONNECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_APPCONNECT_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_PRETRANSFER_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PRETRANSFER_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_STARTTRANSFER_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_STARTTRANSFER_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_SIZE_UPLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SIZE_UPLOAD, &doubleinfo))
                  fprintf(stream, "%.0f", doubleinfo);
                break;
              case VAR_SIZE_DOWNLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SIZE_DOWNLOAD,
                                     &doubleinfo))
                  fprintf(stream, "%.0f", doubleinfo);
                break;
              case VAR_SPEED_DOWNLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SPEED_DOWNLOAD,
                                     &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_SPEED_UPLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SPEED_UPLOAD, &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_CONTENT_TYPE:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_CONTENT_TYPE, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_FTP_ENTRY_PATH:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_FTP_ENTRY_PATH, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_REDIRECT_URL:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_REDIRECT_URL, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_SSL_VERIFY_RESULT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SSL_VERIFYRESULT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_PROXY_SSL_VERIFY_RESULT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PROXY_SSL_VERIFYRESULT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_EFFECTIVE_FILENAME:
                if(per->outs.filename)
                  fputs(per->outs.filename, stream);
                break;
              case VAR_PRIMARY_IP:
                if((CURLE_OK == curl_easy_getinfo(curl, CURLINFO_PRIMARY_IP,
                                                  &stringp)) && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_PRIMARY_PORT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PRIMARY_PORT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_LOCAL_IP:
                if((CURLE_OK == curl_easy_getinfo(curl, CURLINFO_LOCAL_IP,
                                                  &stringp)) && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_LOCAL_PORT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_LOCAL_PORT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_HTTP_VERSION:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HTTP_VERSION,
                                     &longinfo)) {
                  const char *version = "0";
                  switch(longinfo) {
                  case CURL_HTTP_VERSION_1_0:
                    version = "1.0";
                    break;
                  case CURL_HTTP_VERSION_1_1:
                    version = "1.1";
                    break;
                  case CURL_HTTP_VERSION_2_0:
                    version = "2";
                    break;
                  case CURL_HTTP_VERSION_3:
                    version = "3";
                    break;
                  }

                  fprintf(stream, version);
                }
                break;
              case VAR_SCHEME:
                if((CURLE_OK == curl_easy_getinfo(curl, CURLINFO_SCHEME,
                                                  &stringp)) && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_STDOUT:
                stream = stdout;
                break;
              case VAR_STDERR:
                stream = stderr;
                break;
              case VAR_JSON:
                ourWriteOutJSON(variables, curl, per, stream);
              default:
                break;
              }
              break;
            }
          }
          if(!match) {
            fprintf(stderr, "curl: unknown --write-out variable: '%s'\n", ptr);
          }
          ptr = end + 1; /* pass the end */
          *end = keepit;
        }
        else {
          /* illegal syntax, then just output the characters that are used */
          fputc('%', stream);
          fputc(ptr[1], stream);
          ptr += 2;
        }
      }
    }
    else if('\\' == *ptr && ptr[1]) {
      switch(ptr[1]) {
      case 'r':
        fputc('\r', stream);
        break;
      case 'n':
        fputc('\n', stream);
        break;
      case 't':
        fputc('\t', stream);
        break;
      default:
        /* unknown, just output this */
        fputc(*ptr, stream);
        fputc(ptr[1], stream);
        break;
      }
      ptr += 2;
    }
    else {
      fputc(*ptr, stream);
      ptr++;
    }
  }

}